

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestComparisonsF<Counter<unsigned_long,48u>>(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  
  bVar8 = false;
  uVar3 = 0;
  do {
    uVar2 = (ulong)(int)~(uint)uVar3;
    uVar1 = uVar3 + 1;
    uVar6 = uVar2 & 0xffffffffffff;
    iVar7 = 1000;
    uVar4 = 0;
    uVar5 = uVar1;
    do {
      if (uVar6 == uVar4) {
        return bVar8;
      }
      if (uVar6 == uVar5) {
        return bVar8;
      }
      if (uVar4 - uVar5 == 0) {
        return bVar8;
      }
      if ((uVar2 - uVar4 & 0x800000000000) == 0) {
        return bVar8;
      }
      if ((uVar2 - uVar5 & 0x800000000000) == 0) {
        return bVar8;
      }
      if ((uVar4 - uVar5 & 0x800000000000) == 0) {
        return bVar8;
      }
      if ((uVar4 - uVar2 & 0x800000000000) != 0) {
        return bVar8;
      }
      if ((uVar5 - uVar2 & 0x800000000000) != 0) {
        return bVar8;
      }
      if ((uVar5 - uVar4 & 0x800000000000) != 0) {
        return bVar8;
      }
      uVar2 = uVar6 + 1;
      uVar4 = uVar4 + 1 & 0xffffffffffff;
      uVar5 = uVar5 + 1 & 0xffffffffffff;
      uVar6 = uVar2 & 0xffffffffffff;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    iVar7 = 2000;
    do {
      if (uVar6 - uVar4 == 0) {
        return bVar8;
      }
      if (uVar6 - uVar5 == 0) {
        return bVar8;
      }
      if (uVar4 - uVar5 == 0) {
        return bVar8;
      }
      if ((uVar6 - uVar4 & 0x800000000000) == 0) {
        return bVar8;
      }
      if ((uVar6 - uVar5 & 0x800000000000) == 0) {
        return bVar8;
      }
      if ((uVar4 - uVar5 & 0x800000000000) == 0) {
        return bVar8;
      }
      if ((uVar4 - uVar6 & 0x800000000000) != 0) {
        return bVar8;
      }
      if ((uVar5 - uVar6 & 0x800000000000) != 0) {
        return bVar8;
      }
      if ((uVar5 - uVar4 & 0x800000000000) != 0) {
        return bVar8;
      }
      uVar6 = uVar6 + 0xffffffffffff & 0xffffffffffff;
      uVar4 = uVar4 + 0xffffffffffff & 0xffffffffffff;
      uVar5 = uVar5 + 0xffffffffffff & 0xffffffffffff;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    bVar8 = 1 < uVar3;
    uVar3 = uVar1;
    if (uVar1 == 3) {
      return bVar8;
    }
  } while( true );
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}